

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ConfigParseSpecial
              (Fts5Global *pGlobal,Fts5Config *pConfig,char *zCmd,char *zArg,char **pzErr)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  char *pcVar5;
  char **azArg_00;
  char *pcVar6;
  bool bVar7;
  undefined1 local_c8 [8];
  Fts5Enum aDetail [4];
  char *p2;
  char *pSpace;
  char *pDel;
  char **azArg;
  sqlite3_int64 nArg;
  char *p_1;
  int nPre;
  int bFirst;
  char *p;
  int nByte;
  int nCmd;
  int rc;
  char **pzErr_local;
  char *zArg_local;
  char *zCmd_local;
  Fts5Config *pConfig_local;
  Fts5Global *pGlobal_local;
  
  nByte = 0;
  _nCmd = pzErr;
  pzErr_local = (char **)zArg;
  zArg_local = zCmd;
  zCmd_local = (char *)pConfig;
  pConfig_local = (Fts5Config *)pGlobal;
  sVar3 = strlen(zCmd);
  iVar2 = (int)sVar3;
  iVar1 = sqlite3_strnicmp("prefix",zArg_local,iVar2);
  if (iVar1 == 0) {
    bVar7 = true;
    if (*(long *)(zCmd_local + 0x38) == 0) {
      pvVar4 = sqlite3Fts5MallocZero(&nByte,0x7c);
      *(void **)(zCmd_local + 0x38) = pvVar4;
      if (nByte != 0) {
        return nByte;
      }
    }
    _nPre = pzErr_local;
    while( true ) {
      p_1._0_4_ = 0;
      for (; *(char *)_nPre == ' '; _nPre = (char **)((long)_nPre + 1)) {
      }
      if ((bVar7) || (*(char *)_nPre != ',')) {
        if (*(char *)_nPre == '\0') goto LAB_001d190e;
      }
      else {
        do {
          _nPre = (char **)((long)_nPre + 1);
        } while (*(char *)_nPre == ' ');
      }
      if ((*(char *)_nPre < '0') || ('9' < *(char *)_nPre)) {
        pcVar5 = sqlite3_mprintf("malformed prefix=... directive");
        *_nCmd = pcVar5;
        nByte = 1;
        goto LAB_001d190e;
      }
      if (*(int *)(zCmd_local + 0x30) == 0x1f) {
        pcVar5 = sqlite3_mprintf("too many prefix indexes (max %d)",0x1f);
        *_nCmd = pcVar5;
        nByte = 1;
        goto LAB_001d190e;
      }
      while( true ) {
        bVar7 = false;
        if (('/' < *(char *)_nPre) && (bVar7 = false, *(char *)_nPre < ':')) {
          bVar7 = (int)p_1 < 1000;
        }
        if (!bVar7) break;
        p_1._0_4_ = (int)p_1 * 10 + *(char *)_nPre + -0x30;
        _nPre = (char **)((long)_nPre + 1);
      }
      if (((int)p_1 < 1) || (999 < (int)p_1)) break;
      *(int *)(*(long *)(zCmd_local + 0x38) + (long)*(int *)(zCmd_local + 0x30) * 4) = (int)p_1;
      *(int *)(zCmd_local + 0x30) = *(int *)(zCmd_local + 0x30) + 1;
      bVar7 = false;
    }
    pcVar5 = sqlite3_mprintf("prefix length out of range (max 999)");
    *_nCmd = pcVar5;
    nByte = 1;
LAB_001d190e:
    pGlobal_local._4_4_ = nByte;
  }
  else {
    iVar1 = sqlite3_strnicmp("tokenize",zArg_local,iVar2);
    if (iVar1 == 0) {
      nArg = (sqlite3_int64)pzErr_local;
      sVar3 = strlen((char *)pzErr_local);
      azArg_00 = (char **)sqlite3Fts5MallocZero(&nByte,(sVar3 + 1) * 8);
      pcVar5 = (char *)sqlite3Fts5MallocZero(&nByte,(sVar3 + 1) * 2);
      if ((azArg_00 != (char **)0x0) && (pcVar5 != (char *)0x0)) {
        if (*(long *)(zCmd_local + 0x68) == 0) {
          azArg = (char **)0x0;
          p2 = pcVar5;
          while( true ) {
            bVar7 = false;
            if (nArg != 0) {
              bVar7 = *(char *)nArg != '\0';
            }
            if (!bVar7) break;
            aDetail[3]._8_8_ = fts5ConfigSkipWhitespace((char *)nArg);
            if (*(char *)aDetail[3]._8_8_ == '\'') {
              nArg = (sqlite3_int64)fts5ConfigSkipLiteral((char *)aDetail[3]._8_8_);
            }
            else {
              nArg = (sqlite3_int64)fts5ConfigSkipBareword((char *)aDetail[3]._8_8_);
            }
            if (nArg != 0) {
              memcpy(p2,(void *)aDetail[3]._8_8_,nArg - aDetail[3]._8_8_);
              azArg_00[(long)azArg] = p2;
              sqlite3Fts5Dequote(p2);
              p2 = p2 + (nArg - aDetail[3]._8_8_) + 1;
              nArg = (sqlite3_int64)fts5ConfigSkipWhitespace((char *)nArg);
            }
            azArg = (char **)((long)azArg + 1);
          }
          if (nArg == 0) {
            pcVar6 = sqlite3_mprintf("parse error in tokenize directive");
            *_nCmd = pcVar6;
            nByte = 1;
          }
          else {
            nByte = sqlite3Fts5GetTokenizer
                              ((Fts5Global *)pConfig_local,azArg_00,(int)azArg,
                               (Fts5Tokenizer **)(zCmd_local + 0x68),
                               (fts5_tokenizer **)(zCmd_local + 0x70),_nCmd);
          }
        }
        else {
          pcVar6 = sqlite3_mprintf("multiple tokenize=... directives");
          *_nCmd = pcVar6;
          nByte = 1;
        }
      }
      sqlite3_free(azArg_00);
      sqlite3_free(pcVar5);
      pGlobal_local._4_4_ = nByte;
    }
    else {
      iVar1 = sqlite3_strnicmp("content",zArg_local,iVar2);
      if (iVar1 == 0) {
        if (*(int *)(zCmd_local + 0x40) == 0) {
          if (*(char *)pzErr_local == '\0') {
            zCmd_local[0x40] = '\x01';
            zCmd_local[0x41] = '\0';
            zCmd_local[0x42] = '\0';
            zCmd_local[0x43] = '\0';
          }
          else {
            zCmd_local[0x40] = '\x02';
            zCmd_local[0x41] = '\0';
            zCmd_local[0x42] = '\0';
            zCmd_local[0x43] = '\0';
            pcVar5 = sqlite3Fts5Mprintf(&nByte,"%Q.%Q",*(undefined8 *)(zCmd_local + 8),pzErr_local);
            *(char **)(zCmd_local + 0x48) = pcVar5;
          }
        }
        else {
          pcVar5 = sqlite3_mprintf("multiple content=... directives");
          *_nCmd = pcVar5;
          nByte = 1;
        }
        pGlobal_local._4_4_ = nByte;
      }
      else {
        iVar1 = sqlite3_strnicmp("content_rowid",zArg_local,iVar2);
        if (iVar1 == 0) {
          if (*(long *)(zCmd_local + 0x50) == 0) {
            pcVar5 = sqlite3Fts5Strndup(&nByte,(char *)pzErr_local,-1);
            *(char **)(zCmd_local + 0x50) = pcVar5;
          }
          else {
            pcVar5 = sqlite3_mprintf("multiple content_rowid=... directives");
            *_nCmd = pcVar5;
            nByte = 1;
          }
          pGlobal_local._4_4_ = nByte;
        }
        else {
          iVar1 = sqlite3_strnicmp("columnsize",zArg_local,iVar2);
          if (iVar1 == 0) {
            if (((*(char *)pzErr_local == '0') || (*(char *)pzErr_local == '1')) &&
               (*(char *)((long)pzErr_local + 1) == '\0')) {
              *(uint *)(zCmd_local + 0x58) = (uint)(*(char *)pzErr_local == '1');
            }
            else {
              pcVar5 = sqlite3_mprintf("malformed columnsize=... directive");
              *_nCmd = pcVar5;
              nByte = 1;
            }
            pGlobal_local._4_4_ = nByte;
          }
          else {
            iVar2 = sqlite3_strnicmp("detail",zArg_local,iVar2);
            if (iVar2 == 0) {
              memcpy(local_c8,&DAT_0025a300,0x40);
              nByte = fts5ConfigSetEnum((Fts5Enum *)local_c8,(char *)pzErr_local,
                                        (int *)(zCmd_local + 0x5c));
              if (nByte != 0) {
                pcVar5 = sqlite3_mprintf("malformed detail=... directive");
                *_nCmd = pcVar5;
              }
              pGlobal_local._4_4_ = nByte;
            }
            else {
              pcVar5 = sqlite3_mprintf("unrecognized option: \"%.*s\"",sVar3 & 0xffffffff,zArg_local
                                      );
              *_nCmd = pcVar5;
              pGlobal_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  return pGlobal_local._4_4_;
}

Assistant:

static int fts5ConfigParseSpecial(
  Fts5Global *pGlobal,
  Fts5Config *pConfig,            /* Configuration object to update */
  const char *zCmd,               /* Special command to parse */
  const char *zArg,               /* Argument to parse */
  char **pzErr                    /* OUT: Error message */
){
  int rc = SQLITE_OK;
  int nCmd = (int)strlen(zCmd);
  if( sqlite3_strnicmp("prefix", zCmd, nCmd)==0 ){
    const int nByte = sizeof(int) * FTS5_MAX_PREFIX_INDEXES;
    const char *p;
    int bFirst = 1;
    if( pConfig->aPrefix==0 ){
      pConfig->aPrefix = sqlite3Fts5MallocZero(&rc, nByte);
      if( rc ) return rc;
    }

    p = zArg;
    while( 1 ){
      int nPre = 0;

      while( p[0]==' ' ) p++;
      if( bFirst==0 && p[0]==',' ){
        p++;
        while( p[0]==' ' ) p++;
      }else if( p[0]=='\0' ){
        break;
      }
      if( p[0]<'0' || p[0]>'9' ){
        *pzErr = sqlite3_mprintf("malformed prefix=... directive");
        rc = SQLITE_ERROR;
        break;
      }

      if( pConfig->nPrefix==FTS5_MAX_PREFIX_INDEXES ){
        *pzErr = sqlite3_mprintf(
            "too many prefix indexes (max %d)", FTS5_MAX_PREFIX_INDEXES
        );
        rc = SQLITE_ERROR;
        break;
      }

      while( p[0]>='0' && p[0]<='9' && nPre<1000 ){
        nPre = nPre*10 + (p[0] - '0');
        p++;
      }

      if( nPre<=0 || nPre>=1000 ){
        *pzErr = sqlite3_mprintf("prefix length out of range (max 999)");
        rc = SQLITE_ERROR;
        break;
      }

      pConfig->aPrefix[pConfig->nPrefix] = nPre;
      pConfig->nPrefix++;
      bFirst = 0;
    }
    assert( pConfig->nPrefix<=FTS5_MAX_PREFIX_INDEXES );
    return rc;
  }

  if( sqlite3_strnicmp("tokenize", zCmd, nCmd)==0 ){
    const char *p = (const char*)zArg;
    sqlite3_int64 nArg = strlen(zArg) + 1;
    char **azArg = sqlite3Fts5MallocZero(&rc, sizeof(char*) * nArg);
    char *pDel = sqlite3Fts5MallocZero(&rc, nArg * 2);
    char *pSpace = pDel;

    if( azArg && pSpace ){
      if( pConfig->pTok ){
        *pzErr = sqlite3_mprintf("multiple tokenize=... directives");
        rc = SQLITE_ERROR;
      }else{
        for(nArg=0; p && *p; nArg++){
          const char *p2 = fts5ConfigSkipWhitespace(p);
          if( *p2=='\'' ){
            p = fts5ConfigSkipLiteral(p2);
          }else{
            p = fts5ConfigSkipBareword(p2);
          }
          if( p ){
            memcpy(pSpace, p2, p-p2);
            azArg[nArg] = pSpace;
            sqlite3Fts5Dequote(pSpace);
            pSpace += (p - p2) + 1;
            p = fts5ConfigSkipWhitespace(p);
          }
        }
        if( p==0 ){
          *pzErr = sqlite3_mprintf("parse error in tokenize directive");
          rc = SQLITE_ERROR;
        }else{
          rc = sqlite3Fts5GetTokenizer(pGlobal, 
              (const char**)azArg, (int)nArg, &pConfig->pTok, &pConfig->pTokApi,
              pzErr
          );
        }
      }
    }

    sqlite3_free(azArg);
    sqlite3_free(pDel);
    return rc;
  }

  if( sqlite3_strnicmp("content", zCmd, nCmd)==0 ){
    if( pConfig->eContent!=FTS5_CONTENT_NORMAL ){
      *pzErr = sqlite3_mprintf("multiple content=... directives");
      rc = SQLITE_ERROR;
    }else{
      if( zArg[0] ){
        pConfig->eContent = FTS5_CONTENT_EXTERNAL;
        pConfig->zContent = sqlite3Fts5Mprintf(&rc, "%Q.%Q", pConfig->zDb,zArg);
      }else{
        pConfig->eContent = FTS5_CONTENT_NONE;
      }
    }
    return rc;
  }

  if( sqlite3_strnicmp("content_rowid", zCmd, nCmd)==0 ){
    if( pConfig->zContentRowid ){
      *pzErr = sqlite3_mprintf("multiple content_rowid=... directives");
      rc = SQLITE_ERROR;
    }else{
      pConfig->zContentRowid = sqlite3Fts5Strndup(&rc, zArg, -1);
    }
    return rc;
  }

  if( sqlite3_strnicmp("columnsize", zCmd, nCmd)==0 ){
    if( (zArg[0]!='0' && zArg[0]!='1') || zArg[1]!='\0' ){
      *pzErr = sqlite3_mprintf("malformed columnsize=... directive");
      rc = SQLITE_ERROR;
    }else{
      pConfig->bColumnsize = (zArg[0]=='1');
    }
    return rc;
  }

  if( sqlite3_strnicmp("detail", zCmd, nCmd)==0 ){
    const Fts5Enum aDetail[] = {
      { "none", FTS5_DETAIL_NONE },
      { "full", FTS5_DETAIL_FULL },
      { "columns", FTS5_DETAIL_COLUMNS },
      { 0, 0 }
    };

    if( (rc = fts5ConfigSetEnum(aDetail, zArg, &pConfig->eDetail)) ){
      *pzErr = sqlite3_mprintf("malformed detail=... directive");
    }
    return rc;
  }

  *pzErr = sqlite3_mprintf("unrecognized option: \"%.*s\"", nCmd, zCmd);
  return SQLITE_ERROR;
}